

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlCompareStartClose(void *vkey,void *member)

{
  undefined4 local_2c;
  int ret;
  htmlStartCloseEntry *entry;
  htmlStartCloseEntry *key;
  void *member_local;
  void *vkey_local;
  
  local_2c = strcmp(*vkey,*member);
  if (local_2c == 0) {
    local_2c = strcmp(*(char **)((long)vkey + 8),*(char **)((long)member + 8));
  }
  return local_2c;
}

Assistant:

static int
htmlCompareStartClose(const void *vkey, const void *member) {
    const htmlStartCloseEntry *key = (const htmlStartCloseEntry *) vkey;
    const htmlStartCloseEntry *entry = (const htmlStartCloseEntry *) member;
    int ret;

    ret = strcmp(key->oldTag, entry->oldTag);
    if (ret == 0)
        ret = strcmp(key->newTag, entry->newTag);

    return(ret);
}